

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O3

void ga_twist_tf_ref_to_tgt(ga_pose *x,ga_twist *xd,ga_twist *r)

{
  frame *pfVar1;
  body *pbVar2;
  
  if (x == (ga_pose *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x88,
                  "void ga_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (xd == (ga_twist *)0x0) {
    __assert_fail("xd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x89,
                  "void ga_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (r == (ga_twist *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x8a,
                  "void ga_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  if (xd != r) {
    if (xd->point != xd->frame->origin) {
      __assert_fail("xd->point == xd->frame->origin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                    ,0x8c,
                    "void ga_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_twist *, struct ga_twist *)"
                   );
    }
    if (xd->frame == x->reference_frame) {
      pbVar2 = xd->reference_body;
      r->target_body = xd->target_body;
      r->reference_body = pbVar2;
      pfVar1 = x->target_frame;
      r->frame = pfVar1;
      r->point = pfVar1->origin;
      return;
    }
    __assert_fail("xd->frame == x->reference_frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x8d,
                  "void ga_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_twist *, struct ga_twist *)"
                 );
  }
  __assert_fail("xd != r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x8b,
                "void ga_twist_tf_ref_to_tgt(const struct ga_pose *, const struct ga_twist *, struct ga_twist *)"
               );
}

Assistant:

void ga_twist_tf_ref_to_tgt(
        const struct ga_pose *x,
        const struct ga_twist *xd,
        struct ga_twist *r)
{
    assert(x);
    assert(xd);
    assert(r);
    assert(xd != r);
    assert(xd->point == xd->frame->origin);       // screw twist
    assert(xd->frame == x->reference_frame);

    r->target_body = xd->target_body;
    r->reference_body = xd->reference_body;
    r->frame = x->target_frame;
    r->point = r->frame->origin;
}